

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmunl(mcmcx1def *ctx,mcmon n,mcmon *lst)

{
  mcmodef *pmVar1;
  uint uVar2;
  mcmodef *local_40;
  mcmodef *local_38;
  mcmodef *prv;
  mcmodef *nxt;
  mcmodef *o;
  mcmon *lst_local;
  mcmon n_local;
  mcmcx1def *ctx_local;
  
  pmVar1 = ctx->mcmcxtab[(int)(uint)n >> 8];
  uVar2 = n & 0xff;
  if (lst == &ctx->mcmcxlru) {
    if (ctx->mcmcxmru == n) {
      ctx->mcmcxmru = pmVar1[(int)uVar2].mcmoprv;
      if (ctx->mcmcxmru == 0xffff) {
        ctx->mcmcxlru = 0xffff;
      }
      else {
        ctx->mcmcxtab[(int)(uint)ctx->mcmcxmru >> 8][(int)(ctx->mcmcxmru & 0xff)].mcmonxt = 0xffff;
      }
    }
    pmVar1[(int)uVar2].mcmoflg = pmVar1[(int)uVar2].mcmoflg & 0xffef;
  }
  if (pmVar1[(int)uVar2].mcmonxt == 0xffff) {
    local_38 = (mcmodef *)0x0;
  }
  else {
    local_38 = ctx->mcmcxtab[(int)(uint)pmVar1[(int)uVar2].mcmonxt >> 8] +
               (int)(pmVar1[(int)uVar2].mcmonxt & 0xff);
  }
  if (pmVar1[(int)uVar2].mcmoprv == 0xffff) {
    local_40 = (mcmodef *)0x0;
  }
  else {
    local_40 = ctx->mcmcxtab[(int)(uint)pmVar1[(int)uVar2].mcmoprv >> 8] +
               (int)(pmVar1[(int)uVar2].mcmoprv & 0xff);
  }
  if (local_38 != (mcmodef *)0x0) {
    local_38->mcmoprv = pmVar1[(int)uVar2].mcmoprv;
  }
  if (local_40 == (mcmodef *)0x0) {
    *lst = pmVar1[(int)uVar2].mcmonxt;
  }
  else {
    local_40->mcmonxt = pmVar1[(int)uVar2].mcmonxt;
  }
  pmVar1[(int)uVar2].mcmoprv = 0xffff;
  pmVar1[(int)uVar2].mcmonxt = 0xffff;
  return;
}

Assistant:

static void mcmunl(mcmcx1def *ctx, mcmon n, mcmon *lst)
{
    mcmodef *o = mcmgobje(ctx, n);
    mcmodef *nxt;
    mcmodef *prv;
    
    MCMGLBCTX(ctx);

    /* see if this is LRU chain - must deal with MRU pointer if so */
    if (lst == &ctx->mcmcxlru)
    {
        /* if it's at MRU, set MRU pointer to previous object in list */
        if (ctx->mcmcxmru == n)
        {
            ctx->mcmcxmru = o->mcmoprv;     /* set MRU to previous in chain */
            if (ctx->mcmcxmru != MCMONINV)           /* set nxt for new MRU */
                mcmgobje(ctx, ctx->mcmcxmru)->mcmonxt = MCMONINV;
            else
                ctx->mcmcxlru = MCMONINV;     /* nothing in list; clear LRU */
        }
        o->mcmoflg &= ~MCMOFLRU;
    }
    
    nxt = o->mcmonxt == MCMONINV ? (mcmodef *)0 : mcmgobje(ctx, o->mcmonxt);
    prv = o->mcmoprv == MCMONINV ? (mcmodef *)0 : mcmgobje(ctx, o->mcmoprv);
    
    /* set back link for next object, if there is a next object */
    if (nxt) nxt->mcmoprv = o->mcmoprv;
    
    /* set forward link for previous object, or head if no previous object */
    if (prv) prv->mcmonxt = o->mcmonxt;
    else *lst = o->mcmonxt;
    
    o->mcmonxt = o->mcmoprv = MCMONINV;
}